

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmem.c
# Opt level: O0

ppointer p_realloc(ppointer mem,psize n_bytes)

{
  psize n_bytes_local;
  ppointer mem_local;
  
  if (n_bytes == 0) {
    mem_local = (ppointer)0x0;
  }
  else if (mem == (ppointer)0x0) {
    mem_local = (*p_mem_table.f_malloc)(n_bytes);
  }
  else {
    mem_local = (*p_mem_table.f_realloc)(mem,n_bytes);
  }
  return mem_local;
}

Assistant:

P_LIB_API ppointer
p_realloc (ppointer mem, psize n_bytes)
{
	if (P_UNLIKELY (n_bytes == 0))
		return NULL;

	if (P_UNLIKELY (mem == NULL))
		return p_mem_table.f_malloc (n_bytes);
	else
		return p_mem_table.f_realloc (mem, n_bytes);
}